

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O2

int Gia_Truth6ToGia(Gia_Man_t *p,int *pVarLits,int nVars,word Truth,int fHash)

{
  int iVar1;
  int iData1;
  byte bVar2;
  uint uVar3;
  
  if (Truth == 0) {
    iVar1 = 0;
  }
  else {
    if (Truth != 0xffffffffffffffff) {
      if (nVars < 1) {
        __assert_fail("nVars > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                      ,0xb6,"int Gia_Truth6ToGia(Gia_Man_t *, int *, int, word, int)");
      }
      do {
        uVar3 = nVars;
        if ((int)uVar3 < 1) {
          __assert_fail("Var >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                        ,0xbb,"int Gia_Truth6ToGia(Gia_Man_t *, int *, int, word, int)");
        }
        nVars = uVar3 - 1;
        iVar1 = Abc_Tt6HasVar(Truth,nVars);
      } while (iVar1 == 0);
      if (6 < uVar3) {
        __assert_fail("iVar >= 0 && iVar < 6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x337,"word Abc_Tt6Cofactor0(word, int)");
      }
      bVar2 = (byte)(1 << ((byte)nVars & 0x1f));
      iVar1 = Gia_Truth6ToGia(p,pVarLits,nVars,
                              (s_Truths6Neg[(uint)nVars] & Truth) << (bVar2 & 0x3f) |
                              s_Truths6Neg[(uint)nVars] & Truth,fHash);
      iData1 = Gia_Truth6ToGia(p,pVarLits,nVars,
                               (Truth & s_Truths6[(uint)nVars]) >> (bVar2 & 0x3f) |
                               Truth & s_Truths6[(uint)nVars],fHash);
      if (fHash == 0) {
        iVar1 = Gia_ManAppendMux(p,pVarLits[(uint)nVars],iData1,iVar1);
        return iVar1;
      }
      iVar1 = Gia_ManHashMux(p,pVarLits[(uint)nVars],iData1,iVar1);
      return iVar1;
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Gia_Truth6ToGia( Gia_Man_t * p, int * pVarLits, int nVars, word Truth, int fHash )
{
    int Var, Lit0, Lit1; 
    if ( Truth == 0 )
        return 0;
    if ( ~Truth == 0 )
        return 1;
    assert( nVars > 0 );
    // find the topmost var
    for ( Var = nVars-1; Var >= 0; Var-- )
        if ( Abc_Tt6HasVar( Truth, Var ) )
             break;
    assert( Var >= 0 );
    // cofactor
    Lit0 = Gia_Truth6ToGia( p, pVarLits, Var, Abc_Tt6Cofactor0(Truth, Var), fHash );
    Lit1 = Gia_Truth6ToGia( p, pVarLits, Var, Abc_Tt6Cofactor1(Truth, Var), fHash );
    if ( fHash )
        return Gia_ManHashMux( p, pVarLits[Var], Lit1, Lit0 );
    else
        return Gia_ManAppendMux( p, pVarLits[Var], Lit1, Lit0 );
}